

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *weight_hr,Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint _h;
  void *pvVar9;
  size_t sVar10;
  int *piVar11;
  void *pvVar12;
  int qq;
  uint uVar13;
  void *pvVar14;
  void *pvVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  float *pfVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  float H;
  float fVar29;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  Mat local_128;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  Mat *local_a8;
  Mat *local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  Mat local_78;
  
  iVar6 = bottom_blob->w;
  uVar7 = bottom_blob->h;
  uVar8 = top_blob->w;
  _h = cell_state->w;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  local_a0 = top_blob;
  Mat::create(&local_128,4,_h,4,opt->workspace_allocator);
  iVar24 = -100;
  if ((local_128.data == (void *)0x0) || ((long)local_128.c * local_128.cstep == 0))
  goto LAB_0034a5a0;
  local_78.cstep = 0;
  uVar26 = (ulong)(int)_h;
  local_78.data._0_4_ = 0;
  local_78.data._4_4_ = 0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator._0_4_ = 0;
  local_78.allocator._4_4_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  if (uVar8 == _h) {
LAB_00349aeb:
    local_b0 = uVar26 & 0xfffffffffffffffe;
    local_c0 = uVar26 & 0xfffffffffffffffc;
    uVar16 = (int)_h >> 1;
    if ((int)_h >> 1 < 1) {
      uVar16 = 0;
    }
    local_80 = (ulong)uVar16;
    uVar19 = (ulong)(uint)((int)_h >> 2);
    if ((int)_h >> 2 < 1) {
      uVar19 = 0;
    }
    uVar28 = 0;
    if (0 < (int)_h) {
      uVar28 = (ulong)_h;
    }
    local_98 = 0;
    if (0 < (int)uVar8) {
      local_98 = (ulong)uVar8;
    }
    uVar16 = 0;
    if (0 < (int)uVar7) {
      uVar16 = uVar7;
    }
    local_b8 = uVar19 << 2;
    local_a8 = weight_hc;
    local_90 = uVar28;
    for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
      uVar13 = ~uVar17 + uVar7;
      if (reverse == 0) {
        uVar13 = uVar17;
      }
      lVar20 = (long)(int)uVar13;
      for (uVar19 = 0; uVar22 = local_b0, uVar19 != local_80; uVar19 = uVar19 + 1) {
        pfVar21 = (float *)((long)weight_xc->w * uVar19 * weight_xc->elemsize +
                           (long)weight_xc->data);
        pfVar23 = (float *)((long)bias_c->data + uVar19 * 0x20);
        fVar29 = *pfVar23;
        fVar33 = pfVar23[1];
        fVar34 = pfVar23[2];
        fVar35 = pfVar23[3];
        fVar36 = pfVar23[4];
        fVar37 = pfVar23[5];
        fVar38 = pfVar23[6];
        fVar39 = pfVar23[7];
        pfVar23 = (float *)(bottom_blob->w * lVar20 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar40 = 0.0;
        fVar46 = 0.0;
        fVar49 = 0.0;
        fVar50 = 0.0;
        fVar51 = 0.0;
        fVar52 = 0.0;
        auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
        for (iVar24 = 0; iVar24 + 3 < iVar6; iVar24 = iVar24 + 4) {
          fVar2 = *pfVar23;
          fVar3 = pfVar23[1];
          fVar4 = pfVar23[2];
          fVar5 = pfVar23[3];
          fVar29 = fVar2 * *pfVar21 + fVar29;
          fVar33 = fVar2 * pfVar21[1] + fVar33;
          fVar34 = fVar2 * pfVar21[2] + fVar34;
          fVar35 = fVar2 * pfVar21[3] + fVar35;
          fVar36 = fVar2 * pfVar21[4] + fVar36;
          fVar37 = fVar2 * pfVar21[5] + fVar37;
          fVar38 = fVar2 * pfVar21[6] + fVar38;
          fVar39 = fVar2 + fVar39;
          auVar63 = ZEXT3264(CONCAT428(fVar2 + auVar63._28_4_,
                                       CONCAT424(fVar3 * pfVar21[0xe] + auVar63._24_4_,
                                                 CONCAT420(fVar3 * pfVar21[0xd] + auVar63._20_4_,
                                                           CONCAT416(fVar3 * pfVar21[0xc] +
                                                                     auVar63._16_4_,
                                                                     CONCAT412(fVar3 * pfVar21[0xb]
                                                                               + auVar63._12_4_,
                                                                               CONCAT48(fVar3 * 
                                                  pfVar21[10] + auVar63._8_4_,
                                                  CONCAT44(fVar3 * pfVar21[9] + auVar63._4_4_,
                                                           fVar3 * pfVar21[8] + auVar63._0_4_)))))))
                            );
          auVar56 = ZEXT3264(CONCAT428(fVar3 + auVar56._28_4_,
                                       CONCAT424(fVar4 * pfVar21[0x16] + auVar56._24_4_,
                                                 CONCAT420(fVar4 * pfVar21[0x15] + auVar56._20_4_,
                                                           CONCAT416(fVar4 * pfVar21[0x14] +
                                                                     auVar56._16_4_,
                                                                     CONCAT412(fVar4 * pfVar21[0x13]
                                                                               + auVar56._12_4_,
                                                                               CONCAT48(fVar4 * 
                                                  pfVar21[0x12] + auVar56._8_4_,
                                                  CONCAT44(fVar4 * pfVar21[0x11] + auVar56._4_4_,
                                                           fVar4 * pfVar21[0x10] + auVar56._0_4_))))
                                                  ))));
          fVar40 = fVar5 * pfVar21[0x18] + fVar40;
          fVar46 = fVar5 * pfVar21[0x19] + fVar46;
          fVar47 = fVar5 * pfVar21[0x1a] + fVar47;
          fVar48 = fVar5 * pfVar21[0x1b] + fVar48;
          fVar49 = fVar5 * pfVar21[0x1c] + fVar49;
          fVar50 = fVar5 * pfVar21[0x1d] + fVar50;
          fVar51 = fVar5 * pfVar21[0x1e] + fVar51;
          fVar52 = fVar2 + fVar52;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x20;
        }
        lVar27 = 0;
        for (; iVar24 < iVar6; iVar24 = iVar24 + 1) {
          fVar2 = *(float *)((long)pfVar23 + lVar27);
          pfVar1 = pfVar21 + lVar27 * 2;
          fVar29 = fVar2 * *pfVar1 + fVar29;
          fVar33 = fVar2 * pfVar1[1] + fVar33;
          fVar34 = fVar2 * pfVar1[2] + fVar34;
          fVar35 = fVar2 * pfVar1[3] + fVar35;
          fVar36 = fVar2 * pfVar1[4] + fVar36;
          fVar37 = fVar2 * pfVar1[5] + fVar37;
          fVar38 = fVar2 * pfVar1[6] + fVar38;
          fVar39 = fVar2 + fVar39;
          lVar27 = lVar27 + 4;
        }
        pfVar21 = (float *)((long)local_a8->data + (long)local_a8->w * uVar19 * local_a8->elemsize);
        pfVar23 = (float *)hidden_state->data;
        iVar24 = 0;
        while( true ) {
          if ((int)uVar8 <= iVar24 + 3) break;
          fVar2 = *pfVar23;
          fVar3 = pfVar23[1];
          fVar4 = pfVar23[2];
          fVar5 = pfVar23[3];
          fVar29 = fVar2 * *pfVar21 + fVar29;
          fVar33 = fVar2 * pfVar21[1] + fVar33;
          fVar34 = fVar2 * pfVar21[2] + fVar34;
          fVar35 = fVar2 * pfVar21[3] + fVar35;
          fVar36 = fVar2 * pfVar21[4] + fVar36;
          fVar37 = fVar2 * pfVar21[5] + fVar37;
          fVar38 = fVar2 * pfVar21[6] + fVar38;
          fVar39 = fVar2 + fVar39;
          auVar63 = ZEXT3264(CONCAT428(fVar2 + auVar63._28_4_,
                                       CONCAT424(fVar3 * pfVar21[0xe] + auVar63._24_4_,
                                                 CONCAT420(fVar3 * pfVar21[0xd] + auVar63._20_4_,
                                                           CONCAT416(fVar3 * pfVar21[0xc] +
                                                                     auVar63._16_4_,
                                                                     CONCAT412(fVar3 * pfVar21[0xb]
                                                                               + auVar63._12_4_,
                                                                               CONCAT48(fVar3 * 
                                                  pfVar21[10] + auVar63._8_4_,
                                                  CONCAT44(fVar3 * pfVar21[9] + auVar63._4_4_,
                                                           fVar3 * pfVar21[8] + auVar63._0_4_)))))))
                            );
          auVar56 = ZEXT3264(CONCAT428(fVar3 + auVar56._28_4_,
                                       CONCAT424(fVar4 * pfVar21[0x16] + auVar56._24_4_,
                                                 CONCAT420(fVar4 * pfVar21[0x15] + auVar56._20_4_,
                                                           CONCAT416(fVar4 * pfVar21[0x14] +
                                                                     auVar56._16_4_,
                                                                     CONCAT412(fVar4 * pfVar21[0x13]
                                                                               + auVar56._12_4_,
                                                                               CONCAT48(fVar4 * 
                                                  pfVar21[0x12] + auVar56._8_4_,
                                                  CONCAT44(fVar4 * pfVar21[0x11] + auVar56._4_4_,
                                                           fVar4 * pfVar21[0x10] + auVar56._0_4_))))
                                                  ))));
          fVar40 = fVar5 * pfVar21[0x18] + fVar40;
          fVar46 = fVar5 * pfVar21[0x19] + fVar46;
          fVar47 = fVar5 * pfVar21[0x1a] + fVar47;
          fVar48 = fVar5 * pfVar21[0x1b] + fVar48;
          fVar49 = fVar5 * pfVar21[0x1c] + fVar49;
          fVar50 = fVar5 * pfVar21[0x1d] + fVar50;
          fVar51 = fVar5 * pfVar21[0x1e] + fVar51;
          fVar52 = fVar2 + fVar52;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x20;
          iVar24 = iVar24 + 4;
        }
        lVar27 = 0;
        for (; iVar24 < (int)uVar8; iVar24 = iVar24 + 1) {
          fVar2 = *(float *)((long)pfVar23 + lVar27);
          pfVar1 = pfVar21 + lVar27 * 2;
          fVar29 = fVar2 * *pfVar1 + fVar29;
          fVar33 = fVar2 * pfVar1[1] + fVar33;
          fVar34 = fVar2 * pfVar1[2] + fVar34;
          fVar35 = fVar2 * pfVar1[3] + fVar35;
          fVar36 = fVar2 * pfVar1[4] + fVar36;
          fVar37 = fVar2 * pfVar1[5] + fVar37;
          fVar38 = fVar2 * pfVar1[6] + fVar38;
          fVar39 = fVar2 + fVar39;
          lVar27 = lVar27 + 4;
        }
        pfVar23 = (float *)((long)local_128.data +
                           uVar19 * 2 * (long)local_128.w *
                           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize));
        *pfVar23 = auVar56._0_4_ + fVar40 + auVar63._0_4_ + fVar29;
        pfVar23[1] = auVar56._4_4_ + fVar46 + auVar63._4_4_ + fVar33;
        pfVar23[2] = auVar56._8_4_ + fVar47 + auVar63._8_4_ + fVar34;
        pfVar23[3] = auVar56._12_4_ + fVar48 + auVar63._12_4_ + fVar35;
        pfVar23[4] = auVar56._16_4_ + fVar49 + auVar63._16_4_ + fVar36;
        pfVar23[5] = auVar56._20_4_ + fVar50 + auVar63._20_4_ + fVar37;
        pfVar23[6] = auVar56._24_4_ + fVar51 + auVar63._24_4_ + fVar38;
        pfVar23[7] = auVar56._28_4_ + fVar52 + auVar63._28_4_ + fVar39;
      }
      for (; (long)uVar22 < (long)uVar26; uVar22 = uVar22 + 1) {
        uVar19 = (ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff;
        lVar27 = (long)((int)((long)uVar19 % 2) + (int)((long)uVar19 / 2));
        pfVar21 = (float *)(weight_xc->w * lVar27 * weight_xc->elemsize + (long)weight_xc->data);
        pfVar23 = (float *)((long)bias_c->data + uVar22 * 0x10);
        fVar29 = *pfVar23;
        fVar33 = pfVar23[1];
        fVar34 = pfVar23[2];
        fVar35 = pfVar23[3];
        pfVar23 = (float *)(bottom_blob->w * lVar20 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        auVar66 = ZEXT816(0) << 0x40;
        auVar58 = ZEXT816(0) << 0x40;
        for (iVar24 = 0; iVar24 + 3 < iVar6; iVar24 = iVar24 + 4) {
          fVar47 = *pfVar23;
          fVar48 = pfVar23[1];
          fVar40 = pfVar23[2];
          fVar46 = pfVar23[3];
          fVar29 = fVar47 * *pfVar21 + fVar29;
          fVar33 = fVar47 * pfVar21[1] + fVar33;
          fVar34 = fVar47 * pfVar21[2] + fVar34;
          fVar35 = fVar47 * pfVar21[3] + fVar35;
          fVar36 = fVar48 * pfVar21[4] + fVar36;
          fVar37 = fVar48 * pfVar21[5] + fVar37;
          fVar38 = fVar48 * pfVar21[6] + fVar38;
          fVar39 = fVar48 * pfVar21[7] + fVar39;
          auVar53._0_4_ = fVar40 * pfVar21[8] + auVar66._0_4_;
          auVar53._4_4_ = fVar40 * pfVar21[9] + auVar66._4_4_;
          auVar53._8_4_ = fVar40 * pfVar21[10] + auVar66._8_4_;
          auVar53._12_4_ = fVar40 * pfVar21[0xb] + auVar66._12_4_;
          auVar57._0_4_ = fVar46 * pfVar21[0xc] + auVar58._0_4_;
          auVar57._4_4_ = fVar46 * pfVar21[0xd] + auVar58._4_4_;
          auVar57._8_4_ = fVar46 * pfVar21[0xe] + auVar58._8_4_;
          auVar57._12_4_ = fVar46 * pfVar21[0xf] + auVar58._12_4_;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x10;
          auVar66 = auVar53;
          auVar58 = auVar57;
        }
        lVar25 = 0;
        for (; iVar24 < iVar6; iVar24 = iVar24 + 1) {
          fVar47 = *(float *)((long)pfVar23 + lVar25);
          pfVar1 = pfVar21 + lVar25;
          fVar29 = fVar47 * *pfVar1 + fVar29;
          fVar33 = fVar47 * pfVar1[1] + fVar33;
          fVar34 = fVar47 * pfVar1[2] + fVar34;
          fVar35 = fVar47 * pfVar1[3] + fVar35;
          lVar25 = lVar25 + 4;
        }
        pfVar21 = (float *)((long)local_a8->data + local_a8->w * lVar27 * local_a8->elemsize);
        pfVar23 = (float *)hidden_state->data;
        iVar24 = 0;
        while( true ) {
          fVar47 = auVar66._4_4_;
          fVar48 = auVar66._8_4_;
          fVar40 = auVar66._12_4_;
          fVar46 = auVar58._4_4_;
          fVar49 = auVar58._8_4_;
          fVar50 = auVar58._12_4_;
          if ((int)uVar8 <= iVar24 + 3) break;
          fVar51 = *pfVar23;
          fVar52 = pfVar23[1];
          fVar2 = pfVar23[2];
          fVar3 = pfVar23[3];
          fVar29 = fVar51 * *pfVar21 + fVar29;
          fVar33 = fVar51 * pfVar21[1] + fVar33;
          fVar34 = fVar51 * pfVar21[2] + fVar34;
          fVar35 = fVar51 * pfVar21[3] + fVar35;
          fVar36 = fVar52 * pfVar21[4] + fVar36;
          fVar37 = fVar52 * pfVar21[5] + fVar37;
          fVar38 = fVar52 * pfVar21[6] + fVar38;
          fVar39 = fVar52 * pfVar21[7] + fVar39;
          auVar66._0_4_ = fVar2 * pfVar21[8] + auVar66._0_4_;
          auVar66._4_4_ = fVar2 * pfVar21[9] + fVar47;
          auVar66._8_4_ = fVar2 * pfVar21[10] + fVar48;
          auVar66._12_4_ = fVar2 * pfVar21[0xb] + fVar40;
          auVar58._0_4_ = fVar3 * pfVar21[0xc] + auVar58._0_4_;
          auVar58._4_4_ = fVar3 * pfVar21[0xd] + fVar46;
          auVar58._8_4_ = fVar3 * pfVar21[0xe] + fVar49;
          auVar58._12_4_ = fVar3 * pfVar21[0xf] + fVar50;
          pfVar23 = pfVar23 + 4;
          pfVar21 = pfVar21 + 0x10;
          iVar24 = iVar24 + 4;
        }
        lVar27 = 0;
        for (; iVar24 < (int)uVar8; iVar24 = iVar24 + 1) {
          fVar51 = *(float *)((long)pfVar23 + lVar27);
          pfVar1 = pfVar21 + lVar27;
          fVar29 = fVar51 * *pfVar1 + fVar29;
          fVar33 = fVar51 * pfVar1[1] + fVar33;
          fVar34 = fVar51 * pfVar1[2] + fVar34;
          fVar35 = fVar51 * pfVar1[3] + fVar35;
          lVar27 = lVar27 + 4;
        }
        pfVar23 = (float *)((long)local_128.data +
                           (long)local_128.w * uVar22 *
                           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize));
        *pfVar23 = auVar66._0_4_ + fVar36 + auVar58._0_4_ + fVar29;
        pfVar23[1] = fVar47 + fVar37 + fVar46 + fVar33;
        pfVar23[2] = fVar48 + fVar38 + fVar49 + fVar34;
        pfVar23[3] = fVar40 + fVar39 + fVar50 + fVar35;
      }
      pvVar18 = (void *)(local_a0->w * lVar20 * local_a0->elemsize + (long)local_a0->data);
      pvVar15 = cell_state->data;
      pvVar9 = hidden_state->data;
      pvVar12 = (void *)CONCAT44(local_78.data._4_4_,local_78.data._0_4_);
      for (lVar20 = 0; local_b8 != lVar20; lVar20 = lVar20 + 4) {
        lVar27 = local_128.w * lVar20 *
                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
        auVar66 = *(undefined1 (*) [16])((long)local_128.data + lVar27 + 0x10);
        auVar58 = *(undefined1 (*) [16])((long)local_128.data + lVar27 + 0x20);
        auVar53 = *(undefined1 (*) [16])((long)local_128.data + lVar27 + 0x30);
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])((long)local_128.data + lVar27),auVar66);
        auVar31 = vunpcklps_avx(auVar58,auVar53);
        auVar30 = vunpckhps_avx(*(undefined1 (*) [16])((long)local_128.data + lVar27),auVar66);
        auVar58 = vunpckhps_avx(auVar58,auVar53);
        auVar66 = vmovlhps_avx(auVar57,auVar31);
        auVar31 = vunpckhpd_avx(auVar57,auVar31);
        auVar57 = vmovlhps_avx(auVar30,auVar58);
        auVar30 = vunpckhpd_avx(auVar30,auVar58);
        auVar41._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
        auVar41._8_4_ = auVar66._8_4_ ^ 0x80000000;
        auVar41._12_4_ = auVar66._12_4_ ^ 0x80000000;
        auVar84._8_4_ = 0x42b0c0a5;
        auVar84._0_8_ = 0x42b0c0a542b0c0a5;
        auVar84._12_4_ = 0x42b0c0a5;
        auVar66 = vminps_avx(auVar84,auVar41);
        auVar85._8_4_ = 0xc2b0c0a5;
        auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar85._12_4_ = 0xc2b0c0a5;
        auVar53 = vmaxps_avx(auVar85,auVar66);
        auVar64._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
        auVar64._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
        auVar64._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
        auVar64._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
        auVar75._0_4_ = (int)auVar64._0_4_;
        auVar75._4_4_ = (int)auVar64._4_4_;
        auVar75._8_4_ = (int)auVar64._8_4_;
        auVar75._12_4_ = (int)auVar64._12_4_;
        auVar58 = vcvtdq2ps_avx(auVar75);
        auVar66 = vcmpps_avx(auVar64,auVar58,1);
        auVar86._8_4_ = 0x3f800000;
        auVar86._0_8_ = 0x3f8000003f800000;
        auVar86._12_4_ = 0x3f800000;
        auVar66 = vandps_avx(auVar86,auVar66);
        auVar66 = vsubps_avx(auVar58,auVar66);
        auVar76._0_4_ = auVar66._0_4_ * 0.6931472;
        auVar76._4_4_ = auVar66._4_4_ * 0.6931472;
        auVar76._8_4_ = auVar66._8_4_ * 0.6931472;
        auVar76._12_4_ = auVar66._12_4_ * 0.6931472;
        auVar58 = vsubps_avx(auVar53,auVar76);
        fVar29 = auVar58._0_4_;
        fVar33 = auVar58._4_4_;
        fVar34 = auVar58._8_4_;
        fVar35 = auVar58._12_4_;
        auVar65._0_4_ = (int)auVar66._0_4_;
        auVar65._4_4_ = (int)auVar66._4_4_;
        auVar65._8_4_ = (int)auVar66._8_4_;
        auVar65._12_4_ = (int)auVar66._12_4_;
        auVar66 = vpslld_avx(auVar65,0x17);
        auVar66 = vpaddd_avx(auVar86,auVar66);
        local_d8 = (fVar29 + 1.0 +
                   fVar29 * fVar29 *
                   (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                     0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar66._0_4_;
        fStack_d4 = (fVar33 + 1.0 +
                    fVar33 * fVar33 *
                    (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                      0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar66._4_4_;
        fStack_d0 = (fVar34 + 1.0 +
                    fVar34 * fVar34 *
                    (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
                      0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar66._8_4_;
        fStack_cc = (fVar35 + 1.0 +
                    fVar35 * fVar35 *
                    (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                      0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar66._12_4_;
        auVar59._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
        auVar59._8_4_ = auVar31._8_4_ ^ 0x80000000;
        auVar59._12_4_ = auVar31._12_4_ ^ 0x80000000;
        auVar66 = vminps_avx(auVar84,auVar59);
        auVar53 = vmaxps_avx(auVar85,auVar66);
        auVar67._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
        auVar67._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
        auVar67._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
        auVar67._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
        auVar77._0_4_ = (int)auVar67._0_4_;
        auVar77._4_4_ = (int)auVar67._4_4_;
        auVar77._8_4_ = (int)auVar67._8_4_;
        auVar77._12_4_ = (int)auVar67._12_4_;
        auVar58 = vcvtdq2ps_avx(auVar77);
        auVar66 = vcmpps_avx(auVar67,auVar58,1);
        auVar66 = vandps_avx(auVar86,auVar66);
        auVar66 = vsubps_avx(auVar58,auVar66);
        auVar78._0_4_ = auVar66._0_4_ * 0.6931472;
        auVar78._4_4_ = auVar66._4_4_ * 0.6931472;
        auVar78._8_4_ = auVar66._8_4_ * 0.6931472;
        auVar78._12_4_ = auVar66._12_4_ * 0.6931472;
        auVar58 = vsubps_avx(auVar53,auVar78);
        fVar29 = auVar58._0_4_;
        fVar35 = auVar58._4_4_;
        fVar38 = auVar58._8_4_;
        fVar48 = auVar58._12_4_;
        auVar68._0_4_ = (int)auVar66._0_4_;
        auVar68._4_4_ = (int)auVar66._4_4_;
        auVar68._8_4_ = (int)auVar66._8_4_;
        auVar68._12_4_ = (int)auVar66._12_4_;
        auVar66 = vpslld_avx(auVar68,0x17);
        auVar31 = vpaddd_avx(auVar86,auVar66);
        auVar54._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
        auVar54._8_4_ = auVar57._8_4_ ^ 0x80000000;
        auVar54._12_4_ = auVar57._12_4_ ^ 0x80000000;
        auVar66 = vminps_avx(auVar84,auVar54);
        auVar53 = vmaxps_avx(auVar85,auVar66);
        auVar69._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
        auVar69._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
        auVar69._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
        auVar69._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
        auVar79._0_4_ = (int)auVar69._0_4_;
        auVar79._4_4_ = (int)auVar69._4_4_;
        auVar79._8_4_ = (int)auVar69._8_4_;
        auVar79._12_4_ = (int)auVar69._12_4_;
        auVar58 = vcvtdq2ps_avx(auVar79);
        auVar66 = vcmpps_avx(auVar69,auVar58,1);
        auVar66 = vandps_avx(auVar86,auVar66);
        auVar66 = vsubps_avx(auVar58,auVar66);
        auVar80._0_4_ = auVar66._0_4_ * 0.6931472;
        auVar80._4_4_ = auVar66._4_4_ * 0.6931472;
        auVar80._8_4_ = auVar66._8_4_ * 0.6931472;
        auVar80._12_4_ = auVar66._12_4_ * 0.6931472;
        auVar58 = vsubps_avx(auVar53,auVar80);
        fVar33 = auVar58._0_4_;
        fVar36 = auVar58._4_4_;
        fVar39 = auVar58._8_4_;
        fVar40 = auVar58._12_4_;
        auVar70._0_4_ = (int)auVar66._0_4_;
        auVar70._4_4_ = (int)auVar66._4_4_;
        auVar70._8_4_ = (int)auVar66._8_4_;
        auVar70._12_4_ = (int)auVar66._12_4_;
        auVar66 = vpslld_avx(auVar70,0x17);
        auVar57 = vpaddd_avx(auVar86,auVar66);
        local_158 = auVar30._0_4_;
        fStack_154 = auVar30._4_4_;
        fStack_150 = auVar30._8_4_;
        fStack_14c = auVar30._12_4_;
        auVar30._0_4_ = local_158 * -2.0;
        auVar30._4_4_ = fStack_154 * -2.0;
        auVar30._8_4_ = fStack_150 * -2.0;
        auVar30._12_4_ = fStack_14c * -2.0;
        auVar66 = vminps_avx(auVar84,auVar30);
        auVar53 = vmaxps_avx(auVar85,auVar66);
        auVar71._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
        auVar71._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
        auVar71._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
        auVar71._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
        auVar81._0_4_ = (int)auVar71._0_4_;
        auVar81._4_4_ = (int)auVar71._4_4_;
        auVar81._8_4_ = (int)auVar71._8_4_;
        auVar81._12_4_ = (int)auVar71._12_4_;
        auVar58 = vcvtdq2ps_avx(auVar81);
        auVar66 = vcmpps_avx(auVar71,auVar58,1);
        auVar66 = vandps_avx(auVar86,auVar66);
        auVar66 = vsubps_avx(auVar58,auVar66);
        auVar82._0_4_ = auVar66._0_4_ * 0.6931472;
        auVar82._4_4_ = auVar66._4_4_ * 0.6931472;
        auVar82._8_4_ = auVar66._8_4_ * 0.6931472;
        auVar82._12_4_ = auVar66._12_4_ * 0.6931472;
        auVar58 = vsubps_avx(auVar53,auVar82);
        fVar34 = auVar58._0_4_;
        fVar37 = auVar58._4_4_;
        fVar47 = auVar58._8_4_;
        fVar46 = auVar58._12_4_;
        auVar42._0_4_ = local_d8 + 1.0;
        auVar42._4_4_ = fStack_d4 + 1.0;
        auVar42._8_4_ = fStack_d0 + 1.0;
        auVar42._12_4_ = fStack_cc + 1.0;
        auVar60._0_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar31._0_4_ + 1.0;
        auVar60._4_4_ =
             (fVar35 + 1.0 +
             fVar35 * fVar35 *
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar31._4_4_ + 1.0;
        auVar60._8_4_ =
             (fVar38 + 1.0 +
             fVar38 * fVar38 *
             (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
               0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar31._8_4_ + 1.0;
        auVar60._12_4_ =
             (fVar48 + 1.0 +
             fVar48 * fVar48 *
             (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
               0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5)) * auVar31._12_4_ + 1.0;
        auVar72._0_4_ = (int)auVar66._0_4_;
        auVar72._4_4_ = (int)auVar66._4_4_;
        auVar72._8_4_ = (int)auVar66._8_4_;
        auVar72._12_4_ = (int)auVar66._12_4_;
        auVar66 = vpslld_avx(auVar72,0x17);
        auVar66 = vpaddd_avx(auVar86,auVar66);
        auVar31._0_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar66._0_4_ + 1.0;
        auVar31._4_4_ =
             (fVar37 + 1.0 +
             fVar37 * fVar37 *
             (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
               0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar66._4_4_ + 1.0;
        auVar31._8_4_ =
             (fVar47 + 1.0 +
             fVar47 * fVar47 *
             (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
               0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5)) * auVar66._8_4_ + 1.0;
        auVar31._12_4_ =
             (fVar46 + 1.0 +
             fVar46 * fVar46 *
             (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
               0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5)) * auVar66._12_4_ + 1.0;
        auVar83._8_4_ = 0x40000000;
        auVar83._0_8_ = 0x4000000040000000;
        auVar83._12_4_ = 0x40000000;
        auVar66 = vdivps_avx(auVar83,auVar31);
        auVar32._0_4_ = auVar66._0_4_ + -1.0;
        auVar32._4_4_ = auVar66._4_4_ + -1.0;
        auVar32._8_4_ = auVar66._8_4_ + -1.0;
        auVar32._12_4_ = auVar66._12_4_ + -1.0;
        auVar66 = vdivps_avx(auVar32,auVar42);
        auVar58 = vdivps_avx(*(undefined1 (*) [16])((long)pvVar15 + lVar20 * 4),auVar60);
        fVar38 = auVar66._0_4_ + auVar58._0_4_;
        fVar47 = auVar66._4_4_ + auVar58._4_4_;
        fVar48 = auVar66._8_4_ + auVar58._8_4_;
        fVar46 = auVar66._12_4_ + auVar58._12_4_;
        auVar43._0_4_ = fVar38 * -2.0;
        auVar43._4_4_ = fVar47 * -2.0;
        auVar43._8_4_ = fVar48 * -2.0;
        auVar43._12_4_ = fVar46 * -2.0;
        auVar66 = vminps_avx(auVar84,auVar43);
        auVar53 = vmaxps_avx(auVar85,auVar66);
        auVar61._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
        auVar61._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
        auVar61._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
        auVar61._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
        auVar73._0_4_ = (int)auVar61._0_4_;
        auVar73._4_4_ = (int)auVar61._4_4_;
        auVar73._8_4_ = (int)auVar61._8_4_;
        auVar73._12_4_ = (int)auVar61._12_4_;
        auVar58 = vcvtdq2ps_avx(auVar73);
        auVar66 = vcmpps_avx(auVar61,auVar58,1);
        auVar66 = vandps_avx(auVar86,auVar66);
        auVar66 = vsubps_avx(auVar58,auVar66);
        auVar74._0_4_ = auVar66._0_4_ * 0.6931472;
        auVar74._4_4_ = auVar66._4_4_ * 0.6931472;
        auVar74._8_4_ = auVar66._8_4_ * 0.6931472;
        auVar74._12_4_ = auVar66._12_4_ * 0.6931472;
        auVar58 = vsubps_avx(auVar53,auVar74);
        fVar29 = auVar58._0_4_;
        fVar34 = auVar58._4_4_;
        fVar35 = auVar58._8_4_;
        fVar37 = auVar58._12_4_;
        auVar62._0_4_ = (int)auVar66._0_4_;
        auVar62._4_4_ = (int)auVar66._4_4_;
        auVar62._8_4_ = (int)auVar66._8_4_;
        auVar62._12_4_ = (int)auVar66._12_4_;
        auVar66 = vpslld_avx(auVar62,0x17);
        auVar66 = vpaddd_avx(auVar86,auVar66);
        auVar55._0_4_ =
             (fVar33 + 1.0 +
             fVar33 * fVar33 *
             (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
               0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar57._0_4_ + 1.0;
        auVar55._4_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar57._4_4_ + 1.0;
        auVar55._8_4_ =
             (fVar39 + 1.0 +
             fVar39 * fVar39 *
             (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
               0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar57._8_4_ + 1.0;
        auVar55._12_4_ =
             (fVar40 + 1.0 +
             fVar40 * fVar40 *
             (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
               0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar57._12_4_ + 1.0;
        auVar44._0_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar66._0_4_ + 1.0;
        auVar44._4_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar66._4_4_ + 1.0;
        auVar44._8_4_ =
             (fVar35 + 1.0 +
             fVar35 * fVar35 *
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar66._8_4_ + 1.0;
        auVar44._12_4_ =
             (fVar37 + 1.0 +
             fVar37 * fVar37 *
             (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
               0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar66._12_4_ + 1.0;
        auVar66 = vdivps_avx(auVar83,auVar44);
        auVar45._0_4_ = auVar66._0_4_ + -1.0;
        auVar45._4_4_ = auVar66._4_4_ + -1.0;
        auVar45._8_4_ = auVar66._8_4_ + -1.0;
        auVar45._12_4_ = auVar66._12_4_ + -1.0;
        auVar66 = vdivps_avx(auVar45,auVar55);
        pfVar23 = (float *)((long)pvVar15 + lVar20 * 4);
        *pfVar23 = fVar38;
        pfVar23[1] = fVar47;
        pfVar23[2] = fVar48;
        pfVar23[3] = fVar46;
        pvVar14 = pvVar12;
        if (uVar8 == _h) {
          *(undefined1 (*) [16])((long)pvVar9 + lVar20 * 4) = auVar66;
          pvVar14 = pvVar18;
        }
        *(undefined1 (*) [16])((long)pvVar14 + lVar20 * 4) = auVar66;
      }
      local_88 = (long)local_128.w *
                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      pfVar23 = (float *)((long)local_128.data + local_88 * local_c0 + 0xc);
      for (uVar19 = local_c0; (long)uVar19 < (long)uVar26; uVar19 = uVar19 + 1) {
        fVar29 = *pfVar23;
        fVar33 = pfVar23[-2];
        fVar34 = pfVar23[-1];
        local_d8 = expf(-pfVar23[-3]);
        local_d8 = local_d8 + 1.0;
        fVar33 = expf(-fVar33);
        fVar34 = expf(-fVar34);
        fVar29 = tanhf(fVar29);
        fVar29 = *(float *)((long)pvVar15 + uVar19 * 4) / (fVar33 + 1.0) + fVar29 / local_d8;
        fVar33 = tanhf(fVar29);
        fVar33 = fVar33 / (fVar34 + 1.0);
        *(float *)((long)pvVar15 + uVar19 * 4) = fVar29;
        pvVar14 = pvVar12;
        if (uVar8 == _h) {
          *(float *)((long)pvVar9 + uVar19 * 4) = fVar33;
          pvVar14 = pvVar18;
        }
        *(float *)((long)pvVar14 + uVar19 * 4) = fVar33;
        pfVar23 = (float *)((long)pfVar23 + local_88);
        uVar28 = local_90;
      }
      if (uVar8 != _h) {
        pvVar15 = weight_hr->data;
        iVar24 = weight_hr->w;
        sVar10 = weight_hr->elemsize;
        for (uVar19 = 0; uVar19 != local_98; uVar19 = uVar19 + 1) {
          fVar29 = 0.0;
          for (uVar22 = 0; uVar28 != uVar22; uVar22 = uVar22 + 1) {
            fVar29 = *(float *)((long)pvVar15 + uVar22 * 4) *
                     *(float *)(CONCAT44(local_78.data._4_4_,local_78.data._0_4_) + uVar22 * 4) +
                     fVar29;
          }
          *(float *)((long)pvVar18 + uVar19 * 4) = fVar29;
          *(float *)((long)pvVar9 + uVar19 * 4) = fVar29;
          pvVar15 = (void *)((long)pvVar15 + (long)iVar24 * sVar10);
        }
      }
    }
    iVar24 = 0;
  }
  else {
    Mat::create(&local_78,_h,4,opt->workspace_allocator);
    iVar24 = -100;
    if ((CONCAT44(local_78.data._4_4_,local_78.data._0_4_) != 0) &&
       ((long)local_78.c * local_78.cstep != 0)) goto LAB_00349aeb;
  }
  piVar11 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if ((long *)CONCAT44(local_78.allocator._4_4_,local_78.allocator._0_4_) == (long *)0x0) {
        free((void *)CONCAT44(local_78.data._4_4_,local_78.data._0_4_));
      }
      else {
        (**(code **)(*(long *)CONCAT44(local_78.allocator._4_4_,local_78.allocator._0_4_) + 0x18))()
        ;
      }
    }
  }
LAB_0034a5a0:
  piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanhf(cell2);
            cell_state[q] = cell2;

            if (num_output == hidden_size)
            {
                hidden_state[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_state[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_state[i] * hr[i];
                }

                hidden_state[q] = H;
                output_data[q] = H;
            }
        }
    }

    return 0;
}